

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void remove_expired(CookieInfo *cookies)

{
  time_t tVar1;
  Cookie *pCVar2;
  Cookie *co;
  Cookie *pCVar3;
  long lVar4;
  bool bVar5;
  
  lVar4 = 0;
  tVar1 = time((time_t *)0x0);
LAB_0039aae0:
  if (lVar4 == 0x100) {
    return;
  }
  pCVar3 = ((Cookie *)(cookies->cookies + lVar4))->next;
  co = (Cookie *)0x0;
  do {
    bVar5 = co == (Cookie *)0x0;
    pCVar2 = co;
    co = pCVar3;
    if (bVar5) {
      pCVar2 = (Cookie *)(cookies->cookies + lVar4);
    }
    while( true ) {
      if (co == (Cookie *)0x0) {
        lVar4 = lVar4 + 1;
        goto LAB_0039aae0;
      }
      pCVar3 = co->next;
      if ((co->expires == 0) || (tVar1 <= co->expires)) break;
      pCVar2->next = pCVar3;
      cookies->numcookies = cookies->numcookies + -1;
      freecookie(co);
      co = pCVar3;
    }
  } while( true );
}

Assistant:

static void remove_expired(struct CookieInfo *cookies)
{
  struct Cookie *co, *nx;
  curl_off_t now = (curl_off_t)time(NULL);
  unsigned int i;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    struct Cookie *pv = NULL;
    co = cookies->cookies[i];
    while(co) {
      nx = co->next;
      if(co->expires && co->expires < now) {
        if(!pv) {
          cookies->cookies[i] = co->next;
        }
        else {
          pv->next = co->next;
        }
        cookies->numcookies--;
        freecookie(co);
      }
      else {
        pv = co;
      }
      co = nx;
    }
  }
}